

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_HashTable.h
# Opt level: O1

Iterator __thiscall
axl::sl::
HashTable<axl::sl::Guid,_axl::err::ErrorProvider_*,_axl::sl::HashDuckType<axl::sl::Guid,_const_axl::sl::Guid_&>,_axl::sl::EqDuckType<axl::sl::Guid,_const_axl::sl::Guid_&>,_const_axl::sl::Guid_&,_axl::err::ErrorProvider_*>
::visit(HashTable<axl::sl::Guid,_axl::err::ErrorProvider_*,_axl::sl::HashDuckType<axl::sl::Guid,_const_axl::sl::Guid_&>,_axl::sl::EqDuckType<axl::sl::Guid,_const_axl::sl::Guid_&>,_const_axl::sl::Guid_&,_axl::err::ErrorProvider_*>
        *this,Guid *key)

{
  Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>_>
  *this_00;
  size_t *psVar1;
  Bucket *pBVar2;
  HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*> *pHVar3;
  undefined8 uVar4;
  bool bVar5;
  long lVar6;
  IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>
  IVar7;
  HashTable<axl::sl::Guid,_axl::err::ErrorProvider_*,_axl::sl::HashDuckType<axl::sl::Guid,_const_axl::sl::Guid_&>,_axl::sl::EqDuckType<axl::sl::Guid,_const_axl::sl::Guid_&>,_const_axl::sl::Guid_&,_axl::err::ErrorProvider_*>
  *pHVar8;
  ListLink *pLVar9;
  AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>
  *pAVar10;
  ListLink *link;
  ulong uVar11;
  size_t sVar12;
  
  this_00 = &this->m_table;
  sVar12 = (this->m_table).
           super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>_>
           .m_count;
  if (sVar12 == 0) {
    sVar12 = 0x20;
    bVar5 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,axl::err::ErrorProvider*>,axl::sl::HashTableEntry<axl::sl::Guid,axl::err::ErrorProvider*>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,axl::err::ErrorProvider*>,axl::sl::HashTableEntry<axl::sl::Guid,axl::err::ErrorProvider*>::GetBucketLink>>>
            ::
            setCountImpl<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,axl::err::ErrorProvider*>,axl::sl::HashTableEntry<axl::sl::Guid,axl::err::ErrorProvider*>::GetBucketLink>>::Construct>
                      ((Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,axl::err::ErrorProvider*>,axl::sl::HashTableEntry<axl::sl::Guid,axl::err::ErrorProvider*>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,axl::err::ErrorProvider*>,axl::sl::HashTableEntry<axl::sl::Guid,axl::err::ErrorProvider*>::GetBucketLink>>>
                        *)this_00,0x20);
    if (!bVar5) {
      return (Iterator)(Entry *)0x0;
    }
  }
  uVar11 = 0x1505;
  lVar6 = 0;
  do {
    uVar11 = (ulong)*(byte *)((long)&key->field_0 + lVar6) + uVar11 * 0x21;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x10);
  bVar5 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>_>
          ::ensureExclusive(this_00);
  pAVar10 = (AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>
             *)0x0;
  if (bVar5) {
    pAVar10 = (this_00->
              super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>_>
              ).m_p;
  }
  IVar7.m_p = pAVar10[uVar11 % sVar12].
              super_ListBase<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>
              .super_ListData<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>_>.
              m_head;
  if (IVar7.m_p != (Entry *)0x0) {
    do {
      if (((((key->field_0).field_0.m_data1 ==
             ((IVar7.m_p)->super_MapEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>).m_key.field_0.
             field_0.m_data1) &&
           ((key->field_0).field_1.m_dword2 ==
            ((IVar7.m_p)->super_MapEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>).m_key.field_0.
            field_1.m_dword2)) &&
          ((key->field_0).field_1.m_dword3 ==
           ((IVar7.m_p)->super_MapEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>).m_key.field_0.
           field_1.m_dword3)) &&
         ((key->field_0).field_1.m_dword4 ==
          ((IVar7.m_p)->super_MapEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>).m_key.field_0.
          field_1.m_dword4)) {
        return (Iterator)IVar7.m_p;
      }
      pLVar9 = ((IVar7.m_p)->m_bucketLink).m_next;
      IVar7.m_p = (Entry *)&pLVar9[-3].m_prev;
    } while (pLVar9 != (ListLink *)0x0);
  }
  pBVar2 = pAVar10 + uVar11 % sVar12;
  IVar7.m_p = (Entry *)operator_new(0x40);
  ((IVar7.m_p)->super_MapEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>).super_ListLink.m_next =
       (ListLink *)0x0;
  ((IVar7.m_p)->super_MapEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>).super_ListLink.m_prev =
       (ListLink *)0x0;
  ((IVar7.m_p)->super_MapEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>).m_value =
       (ErrorProvider *)0x0;
  ((IVar7.m_p)->m_bucketLink).m_next = (ListLink *)0x0;
  ((IVar7.m_p)->m_bucketLink).m_prev = (ListLink *)0x0;
  (IVar7.m_p)->m_bucket = (Bucket *)0x0;
  *(undefined8 *)
   &((IVar7.m_p)->super_MapEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>).m_key.field_0 = 0;
  *(undefined8 *)
   ((long)&((IVar7.m_p)->super_MapEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>).m_key.field_0 + 8
   ) = 0;
  uVar4 = *(undefined8 *)((long)&key->field_0 + 8);
  *(undefined8 *)
   &((IVar7.m_p)->super_MapEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>).m_key.field_0 =
       *(undefined8 *)&key->field_0;
  *(undefined8 *)
   ((long)&((IVar7.m_p)->super_MapEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>).m_key.field_0 + 8
   ) = uVar4;
  (IVar7.m_p)->m_bucket = pBVar2;
  pHVar8 = (HashTable<axl::sl::Guid,_axl::err::ErrorProvider_*,_axl::sl::HashDuckType<axl::sl::Guid,_const_axl::sl::Guid_&>,_axl::sl::EqDuckType<axl::sl::Guid,_const_axl::sl::Guid_&>,_const_axl::sl::Guid_&,_axl::err::ErrorProvider_*>
            *)(this->m_list).
              super_OwningListBase<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>_>_>
              .
              super_ListBase<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>_>
              .super_ListData<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>_>.
              m_tail;
  ((IVar7.m_p)->super_MapEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>).super_ListLink.m_next =
       (ListLink *)0x0;
  ((IVar7.m_p)->super_MapEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>).super_ListLink.m_prev =
       (ListLink *)pHVar8;
  if (pHVar8 == (HashTable<axl::sl::Guid,_axl::err::ErrorProvider_*,_axl::sl::HashDuckType<axl::sl::Guid,_const_axl::sl::Guid_&>,_axl::sl::EqDuckType<axl::sl::Guid,_const_axl::sl::Guid_&>,_const_axl::sl::Guid_&,_axl::err::ErrorProvider_*>
                 *)0x0) {
    pHVar8 = this;
  }
  (pHVar8->m_list).
  super_OwningListBase<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>_>_>
  .
  super_ListBase<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>_>
  .super_ListData<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>_>.m_head =
       IVar7.m_p;
  (this->m_list).
  super_OwningListBase<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>_>_>
  .
  super_ListBase<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>_>
  .super_ListData<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>_>.m_tail =
       IVar7.m_p;
  psVar1 = &(this->m_list).
            super_OwningListBase<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>_>_>
            .
            super_ListBase<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>_>
            .super_ListData<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>_>.
            m_count;
  *psVar1 = *psVar1 + 1;
  pHVar3 = (pBVar2->
           super_ListBase<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>
           ).super_ListData<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>_>.
           m_tail;
  pLVar9 = &pHVar3->m_bucketLink;
  if (pHVar3 == (HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*> *)0x0) {
    pLVar9 = (ListLink *)0x0;
  }
  ((IVar7.m_p)->m_bucketLink).m_next = (ListLink *)0x0;
  ((IVar7.m_p)->m_bucketLink).m_prev = pLVar9;
  if (pHVar3 == (HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*> *)0x0) {
    (pBVar2->
    super_ListBase<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>
    ).super_ListData<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>_>.m_head =
         IVar7.m_p;
  }
  else {
    pLVar9->m_next = &(IVar7.m_p)->m_bucketLink;
  }
  (pBVar2->
  super_ListBase<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>
  ).super_ListData<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>_>.m_tail =
       IVar7.m_p;
  psVar1 = &(pBVar2->
            super_ListBase<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>
            ).super_ListData<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>_>.
            m_count;
  *psVar1 = *psVar1 + 1;
  if (this->m_resizeThreshold <
      ((this->m_list).
       super_OwningListBase<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>_>_>
       .
       super_ListBase<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>_>
       .super_ListData<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>_>.m_count *
      100) / sVar12) {
    setBucketCount(this,sVar12 * 2);
  }
  return (Iterator)IVar7.m_p;
}

Assistant:

Iterator
	visit(KeyArg key) {
		size_t bucketCount = m_table.getCount();
		if (!bucketCount) {
			bucketCount = Def_InitialBucketCount;

			bool result = m_table.setCount(bucketCount);
			if (!result)
				return NULL;
		}

		size_t hash = m_hash(key);
		Bucket* bucket = &m_table.rwi()[hash % bucketCount];
		typename Bucket::Iterator it = bucket->getHead();
		for (; it; it++) {
			bool isEqual = m_eq(key, it->m_key);
			if (isEqual)
				return it;
		}

		Entry* entry = new (mem::ZeroInit) Entry;
		entry->m_key = key;
		entry->m_bucket = bucket;
		m_list.insertTail(entry);
		bucket->insertTail(entry);

	#if (AXL_PTR_BITS == 64)
		size_t loadFactor = getCount() * 100 / bucketCount;
	#else
		size_t loadFactor = (size_t)((uint64_t)getCount() * 100 / bucketCount);
	#endif

		if (loadFactor > m_resizeThreshold)
			setBucketCount(bucketCount * 2);

		return entry;
	}